

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineDocumentHelper.cc
# Opt level: O1

void __thiscall
QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper(QPDFOutlineDocumentHelper *this,QPDF *qpdf)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  QPDFOutlineObjectHelper *__return_storage_ptr__;
  element_type *this_01;
  undefined8 this_02;
  undefined8 uVar1;
  bool bVar2;
  Members *__p;
  _Rb_tree_header *p_Var3;
  QPDFObjGen og;
  QPDFObjectHandle cur;
  QPDFObjectHandle outlines;
  QPDFObjectHandle root;
  set seen;
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [2];
  string local_c8;
  string local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_88;
  string local_80;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_60;
  
  (this->super_QPDFDocumentHelper).qpdf = qpdf;
  (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper =
       (_func_int **)&PTR__QPDFOutlineDocumentHelper_002f2c10;
  __p = (Members *)operator_new(0x98);
  p_Var3 = &(__p->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
            _M_t._M_impl.super__Rb_tree_header;
  memset(__p,0,0x98);
  (__p->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (__p->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  p_Var3 = &(__p->by_page)._M_t._M_impl.super__Rb_tree_header;
  (__p->by_page)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__p->by_page)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
  .super__Rb_tree_header._M_node_count = 0;
  (__p->dest_dict).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__p->dest_dict).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->names_dest).super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (__p->names_dest).super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->by_page)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (__p->by_page)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (__p->by_page)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m).super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = __p;
  this_00 = &(this->m).
             super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<QPDFOutlineDocumentHelper::Members*>(this_00,__p);
  local_88 = this_00;
  QPDF::getRoot((QPDF *)&local_a8);
  local_100._M_allocated_capacity = (size_type)local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_110 + 0x10),"/Outlines","");
  bVar2 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&local_a8,(string *)(local_110 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_allocated_capacity != local_f0) {
    operator_delete((void *)local_100._M_allocated_capacity,local_f0[0]._M_allocated_capacity + 1);
  }
  if (bVar2) {
    local_100._M_allocated_capacity = (size_type)local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_110 + 0x10),"/Outlines","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_c8,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_allocated_capacity != local_f0) {
      operator_delete((void *)local_100._M_allocated_capacity,local_f0[0]._M_allocated_capacity + 1)
      ;
    }
    bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_c8);
    if (bVar2) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/First","");
      bVar2 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&local_c8,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar2 = false;
    }
    if (bVar2 != false) {
      local_100._M_allocated_capacity = (size_type)local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_110 + 0x10),"/First","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_110,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_allocated_capacity != local_f0) {
        operator_delete((void *)local_100._M_allocated_capacity,
                        local_f0[0]._M_allocated_capacity + 1);
      }
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      __return_storage_ptr__ = (QPDFOutlineObjectHelper *)(local_110 + 0x10);
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      while (bVar2 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_110), !bVar2) {
        og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_110);
        bVar2 = QPDFObjGen::set::add((set *)&local_60,og);
        if (!bVar2) break;
        this_01 = (this->m).
                  super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        local_c8.field_2._M_allocated_capacity = local_110._0_8_;
        local_c8.field_2._8_8_ = local_110._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_110._8_8_ + 8) = *(_Atomic_word *)(local_110._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_110._8_8_ + 8) = *(_Atomic_word *)(local_110._8_8_ + 8) + 1;
          }
        }
        QPDFOutlineObjectHelper::Accessor::create
                  (__return_storage_ptr__,(QPDFObjectHandle *)&local_c8.field_2,this,1);
        std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::
        emplace_back<QPDFOutlineObjectHelper>(&this_01->outlines,__return_storage_ptr__);
        QPDFOutlineObjectHelper::~QPDFOutlineObjectHelper(__return_storage_ptr__);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.field_2._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.field_2._8_8_);
        }
        local_100._M_allocated_capacity = (size_type)local_f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"/Next","")
        ;
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_a8.field_2,(string *)local_110);
        uVar1 = local_a8.field_2._8_8_;
        local_110._0_8_ = local_a8.field_2._M_allocated_capacity;
        this_02 = local_110._8_8_;
        local_a8.field_2._M_allocated_capacity = 0;
        local_a8.field_2._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_110._8_8_ = uVar1;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.field_2._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.field_2._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_allocated_capacity != local_f0) {
          operator_delete((void *)local_100._M_allocated_capacity,
                          local_f0[0]._M_allocated_capacity + 1);
        }
      }
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree(&local_60);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length);
  }
  return;
}

Assistant:

QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper(QPDF& qpdf) :
    QPDFDocumentHelper(qpdf),
    m(new Members())
{
    QPDFObjectHandle root = qpdf.getRoot();
    if (!root.hasKey("/Outlines")) {
        return;
    }
    QPDFObjectHandle outlines = root.getKey("/Outlines");
    if (!(outlines.isDictionary() && outlines.hasKey("/First"))) {
        return;
    }
    QPDFObjectHandle cur = outlines.getKey("/First");
    QPDFObjGen::set seen;
    while (!cur.isNull() && seen.add(cur)) {
        m->outlines.push_back(QPDFOutlineObjectHelper::Accessor::create(cur, *this, 1));
        cur = cur.getKey("/Next");
    }
}